

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection-visitor.hpp
# Opt level: O0

void miyuki::refl::
     accept<miyuki::serialize::AutoLoadVisitor,std::shared_ptr<Bar>,std::shared_ptr<Bar>,std::vector<std::shared_ptr<Bar>,std::allocator<std::shared_ptr<Bar>>>>
               (AutoLoadVisitor visitor,char **args_s,shared_ptr<Bar> *t,shared_ptr<Bar> *args,
               vector<std::shared_ptr<Bar>,_std::allocator<std::shared_ptr<Bar>_>_> *args_1)

{
  vector<std::shared_ptr<Bar>,_std::allocator<std::shared_ptr<Bar>_>_> *args_local_1;
  shared_ptr<Bar> *args_local;
  shared_ptr<Bar> *t_local;
  char **args_s_local;
  AutoLoadVisitor visitor_local;
  
  args_s_local = (char **)visitor.ar;
  serialize::AutoLoadVisitor::visit<std::shared_ptr<Bar>&>
            ((AutoLoadVisitor *)&args_s_local,t,*args_s);
  accept<miyuki::serialize::AutoLoadVisitor,std::shared_ptr<Bar>,std::vector<std::shared_ptr<Bar>,std::allocator<std::shared_ptr<Bar>>>>
            ((AutoLoadVisitor)args_s_local,args_s + 1,args,args_1);
  return;
}

Assistant:

void accept(Visitor visitor, const char **args_s, T &t, Args &... args) {
        visitor.visit(t, *args_s);
        accept<Visitor, Args...>(visitor, args_s + 1, args...);
    }